

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_index_t
itree_find_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn)

{
  cell_t *pcVar1;
  cell_t *pcVar2;
  cell_index_t cVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  cell_index_t cVar7;
  
  pcVar1 = t->cell;
  cVar3 = 0xffffffff;
  cVar7 = 0xffffffff;
  if (pcVar1->id != 0xffffffff) {
    cVar7 = 0;
    do {
      if (pcVar1[cVar7].id == left_context) break;
      cVar7 = pcVar1[cVar7].sib;
    } while (cVar7 != 0xffffffff);
  }
  if (cVar7 != 0xffffffff) {
    uVar5 = (ulong)pcVar1[cVar7].child;
    cVar3 = 0xffffffff;
    uVar6 = 0xffffffff;
    uVar4 = pcVar1[cVar7].child;
    if (pcVar1[uVar5].id != 0xffffffff) {
      while ((uVar6 = uVar4, uVar6 != 0xffffffff &&
             (uVar6 = (uint)uVar5, pcVar1[uVar5].id != right_context))) {
        pcVar2 = pcVar1 + uVar5;
        uVar4 = pcVar2->sib;
        uVar5 = (ulong)pcVar2->sib;
      }
    }
    if (uVar6 != 0xffffffff) {
      uVar5 = (ulong)pcVar1[uVar6].child;
      cVar3 = 0xffffffff;
      uVar4 = 0xffffffff;
      uVar6 = pcVar1[uVar6].child;
      if (pcVar1[uVar5].id != 0xffffffff) {
        while ((uVar4 = uVar6, uVar4 != 0xffffffff &&
               (uVar4 = (uint)uVar5, pcVar1[uVar5].id != posn))) {
          pcVar2 = pcVar1 + uVar5;
          uVar6 = pcVar2->sib;
          uVar5 = (ulong)pcVar2->sib;
        }
      }
      if (uVar4 != 0xffffffff) {
        cVar3 = pcVar1[uVar4].child;
      }
    }
  }
  return cVar3;
}

Assistant:

cell_index_t itree_find(itree_t *t,
			cell_index_t *end,
			cell_index_t start,
			cell_id_t id)
{
    cell_t *cell;
    cell_index_t i, l = NO_ID, o;
    
    cell = t->cell;

    if (cell[start].id != NO_ID) {
	for (i = start; (i != NO_ID) && (cell[i].id != id); i = cell[i].sib)
	    l = i;

	if (i != NO_ID)
	    o = i;
	else 
	    o = NULL_INDEX;
    }
    else {
	o = NULL_INDEX;
	l = start;
    }

    *end = l;

    return o;
}